

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::Statement::Statement(Statement *this,CodeLocation *l)

{
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *l_local;
  Statement *this_local;
  
  local_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_28,l);
  Object::Object(&this->super_Object,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Statement_0058b220;
  this->nextObject = (Statement *)0x0;
  return;
}

Assistant:

Statement (CodeLocation l) : Object (std::move (l)) {}